

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderOperatorCase::ShaderOperatorCase
          (ShaderOperatorCase *this,Context *context,char *caseName,char *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,string *shaderOp,ShaderDataSpec *spec)

{
  FloatScalar FVar1;
  undefined8 uVar2;
  FloatScalar FVar3;
  FloatScalar FVar4;
  FloatScalar FVar5;
  FloatScalar FVar6;
  bool bVar7;
  undefined3 uVar8;
  Precision PVar9;
  DataType DVar10;
  DataType DVar11;
  int iVar12;
  int resultScalarSize;
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  undefined4 extraout_var;
  ShaderEvalFunc evalFunc_local;
  bool isVertexCase_local;
  char *description_local;
  char *caseName_local;
  Context *context_local;
  ShaderOperatorCase *this_local;
  
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_0328a680;
  testCtx = gles3::Context::getTestContext(context);
  renderCtx = gles3::Context::getRenderContext(context);
  ctxInfo = gles3::Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,caseName,description,
             isVertexCase,&(this->m_evaluator).super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_0328a680;
  (this->m_spec).inputs[2].rangeMax = spec->inputs[2].rangeMax;
  FVar1 = spec->inputs[2].rangeMin;
  *(undefined8 *)&(this->m_spec).inputs[1].rangeMax.m_value =
       *(undefined8 *)&spec->inputs[1].rangeMax.m_value;
  (this->m_spec).inputs[2].rangeMin = FVar1;
  bVar7 = spec->inputs[1].rangeMin.m_isConstant;
  uVar8 = *(undefined3 *)&spec->inputs[1].rangeMin.field_0x1;
  uVar2 = *(undefined8 *)&spec->inputs[1].rangeMin.m_value;
  (this->m_spec).inputs[1].type = spec->inputs[1].type;
  (this->m_spec).inputs[1].rangeMin.m_isConstant = bVar7;
  *(undefined3 *)&(this->m_spec).inputs[1].rangeMin.field_0x1 = uVar8;
  *(undefined8 *)&(this->m_spec).inputs[1].rangeMin.m_value = uVar2;
  FVar1 = spec->resultScale;
  FVar3 = spec->resultBias;
  FVar4 = spec->referenceScale;
  FVar5 = spec->referenceBias;
  PVar9 = spec->precision;
  DVar10 = spec->output;
  iVar12 = spec->numInputs;
  DVar11 = spec->inputs[0].type;
  FVar6 = spec->inputs[0].rangeMax;
  (this->m_spec).inputs[0].rangeMin = spec->inputs[0].rangeMin;
  (this->m_spec).inputs[0].rangeMax = FVar6;
  (this->m_spec).precision = PVar9;
  (this->m_spec).output = DVar10;
  (this->m_spec).numInputs = iVar12;
  (this->m_spec).inputs[0].type = DVar11;
  (this->m_spec).referenceScale = FVar4;
  (this->m_spec).referenceBias = FVar5;
  (this->m_spec).resultScale = FVar1;
  (this->m_spec).resultBias = FVar3;
  std::__cxx11::string::string((string *)&this->m_shaderOp,(string *)shaderOp);
  iVar12 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  resultScalarSize = glu::getDataTypeScalarSize(spec->output);
  OperatorShaderEvaluator::OperatorShaderEvaluator
            (&this->m_evaluator,(Functions *)CONCAT44(extraout_var,iVar12),
             (byte)~isVertexCase & SHADERTYPE_FRAGMENT,evalFunc,&spec->referenceScale,
             &spec->referenceBias,resultScalarSize);
  return;
}

Assistant:

ShaderOperatorCase::ShaderOperatorCase (Context& context, const char* caseName, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, const string& shaderOp, const ShaderDataSpec& spec)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), caseName, description, isVertexCase, m_evaluator)
	, m_spec			(spec)
	, m_shaderOp		(shaderOp)
	, m_evaluator		(m_renderCtx.getFunctions(), isVertexCase ? SHADERTYPE_VERTEX : SHADERTYPE_FRAGMENT, evalFunc, spec.referenceScale, spec.referenceBias, getDataTypeScalarSize(spec.output))
{
}